

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  FOCC_OTA *pFVar2;
  bool bVar3;
  time_t tVar4;
  ostream *poVar5;
  FOCC_CTA *pFVar6;
  BOCC_CTA *pBVar7;
  reference puVar8;
  thread *ptVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 *puStack_4f0;
  thread atStack_4e8 [2];
  thread *local_4d8;
  thread *local_4d0;
  ostream *local_4c8;
  ostream *local_4c0;
  ostream *local_4b8;
  ostream *local_4b0;
  BOCC_CTA *local_4a8;
  FILE *local_4a0;
  BOCC_CTA *local_498;
  ostream *local_490;
  ostream *local_488;
  ostream *local_480;
  ostream *local_478;
  FOCC_CTA *local_470;
  FILE *local_468;
  FOCC_CTA *local_460;
  ostream *local_458;
  ostream *local_450;
  ostream *local_448;
  ostream *local_440;
  FOCC_OTA *local_438;
  FILE *local_430;
  thread *local_428;
  thread *local_420;
  thread *local_418;
  ulong local_410;
  thread *local_408;
  FOCC_OTA *local_400;
  ostream *local_3f8;
  ostream *local_3f0;
  ostream *local_3e8;
  ostream *local_3e0;
  ostream *local_3d8;
  ostream *local_3d0;
  istream *local_3c8;
  istream *local_3c0;
  istream *local_3b8;
  istream *local_3b0;
  byte local_3a1;
  unsigned_long local_3a0;
  unsigned_long e_5;
  iterator __end1_5;
  iterator __begin1_5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_5;
  unsigned_long e_4;
  iterator __end1_4;
  iterator __begin1_4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_4;
  int i_8;
  int local_34c;
  BOCC_CTA *pBStack_348;
  int i_7;
  BOCC_CTA *boccCta;
  value_type local_338;
  int local_32c;
  unsigned_long uStack_328;
  int i_6;
  unsigned_long e_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_3;
  unsigned_long e_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_2;
  int i_5;
  int local_2d4;
  FOCC_CTA *pFStack_2d0;
  int i_4;
  FOCC_CTA *foccCta;
  value_type local_2c0;
  int local_2b4;
  unsigned_long uStack_2b0;
  int i_3;
  unsigned_long e_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1_1;
  unsigned_long e;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  uint64_t res;
  int i_2;
  int local_254;
  ulong uStack_250;
  int i_1;
  unsigned_long __vla_expr0;
  exponential_distribution<double> local_240;
  value_type local_238 [2];
  int local_228;
  int i;
  istream local_218 [8];
  ifstream inFile;
  
  puStack_4f0 = (undefined1 *)0x10257b;
  tVar4 = time((time_t *)0x0);
  puStack_4f0 = (undefined1 *)0x102582;
  srand((uint)tVar4);
  puStack_4f0 = (undefined1 *)0x10259a;
  std::ifstream::ifstream(local_218,"inp-params.txt",_S_in);
  puStack_4f0 = (undefined1 *)0x1025b2;
  local_3a1 = std::ios::fail();
  if ((local_3a1 & 1) == 0) {
    puStack_4f0 = (undefined1 *)0x10260f;
    local_3b0 = (istream *)std::istream::operator>>(local_218,(int *)&glb::N);
    puStack_4f0 = (undefined1 *)0x10262b;
    local_3b8 = (istream *)std::istream::operator>>(local_3b0,&glb::M);
    puStack_4f0 = (undefined1 *)0x102647;
    local_3c0 = (istream *)std::istream::operator>>(local_3b8,&glb::numTrans);
    puStack_4f0 = (undefined1 *)0x102663;
    local_3c8 = (istream *)std::istream::operator>>(local_3c0,&glb::constVal);
    puStack_4f0 = (undefined1 *)0x10267f;
    std::istream::operator>>(local_3c8,&glb::lambda);
    for (local_228 = 0; local_228 < (int)glb::N; local_228 = local_228 + 1) {
      local_238[1] = 0;
      puStack_4f0 = (undefined1 *)0x1026b7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts,
                 local_238 + 1);
      local_238[0] = 0;
      puStack_4f0 = (undefined1 *)0x1026d7;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay,local_238
                );
    }
    puStack_4f0 = (undefined1 *)0x1026ff;
    local_3d0 = std::operator<<((ostream *)&std::cout,"Input Params: N=");
    puStack_4f0 = (undefined1 *)0x10271a;
    local_3d8 = (ostream *)std::ostream::operator<<(local_3d0,glb::N);
    puStack_4f0 = (undefined1 *)0x102736;
    local_3e0 = std::operator<<(local_3d8," M = ");
    puStack_4f0 = (undefined1 *)0x102751;
    local_3e8 = (ostream *)std::ostream::operator<<(local_3e0,glb::M);
    puStack_4f0 = (undefined1 *)0x10276d;
    local_3f0 = std::operator<<(local_3e8," numTrans = ");
    puStack_4f0 = (undefined1 *)0x102788;
    local_3f8 = (ostream *)std::ostream::operator<<(local_3f0,glb::numTrans);
    puStack_4f0 = (undefined1 *)0x1027a4;
    std::operator<<(local_3f8,"\n");
    puStack_4f0 = (undefined1 *)0x1027ba;
    std::exponential_distribution<double>::exponential_distribution(&local_240,(double)glb::lambda);
    glb::dist = local_240._M_param._M_lambda;
    puStack_4f0 = (undefined1 *)0x1027dd;
    std::operator<<((ostream *)&std::cout,"***** FOCC OTA ******\n");
    puStack_4f0 = (undefined1 *)0x1027e9;
    local_400 = (FOCC_OTA *)operator_new(0x90);
    puStack_4f0 = (undefined1 *)0x102804;
    FOCC_OTA::FOCC_OTA(local_400,glb::M);
    glb::foccOta = local_400;
    local_410 = (ulong)glb::N;
    lVar1 = -(local_410 * 8 + 0xf & 0xfffffffffffffff0);
    local_408 = (thread *)((long)atStack_4e8 + lVar1);
    uStack_250 = local_410;
    __vla_expr0 = (unsigned_long)atStack_4e8;
    if (local_410 != 0) {
      local_420 = local_408 + local_410;
      local_418 = local_408;
      __vla_expr0 = (unsigned_long)atStack_4e8;
      do {
        ptVar9 = local_418;
        local_428 = local_418;
        *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10288d;
        std::thread::thread(ptVar9);
        local_418 = local_428 + 1;
      } while (local_418 != local_420);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1028be;
    glb::log_file = fopen("FOCC-OTA-log.txt","w");
    local_430 = glb::log_file;
    for (local_254 = 0; local_254 < (int)glb::N; local_254 = local_254 + 1) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102912;
      std::thread::thread<void(&)(FOCC_OTA*,int),FOCC_OTA*&,int&,void>
                ((thread *)&stack0xfffffffffffffda0,updtMem,&glb::foccOta,&local_254);
      ptVar9 = local_408 + local_254;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102935;
      std::thread::operator=(ptVar9,(thread *)&stack0xfffffffffffffda0);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102941;
      std::thread::~thread((thread *)&stack0xfffffffffffffda0);
    }
    for (res._4_4_ = 0; res._4_4_ < (int)glb::N; res._4_4_ = res._4_4_ + 1) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1029c0;
      std::thread::join();
    }
    local_438 = glb::foccOta;
    if (glb::foccOta != (FOCC_OTA *)0x0) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1029f5;
      FOCC_OTA::~FOCC_OTA(glb::foccOta);
      pFVar2 = local_438;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102a06;
      operator_delete(pFVar2,0x90);
    }
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102a2b;
    __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay);
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102a3e;
    e = (unsigned_long)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay);
    while( true ) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102a58;
      bVar3 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&e);
      if (!bVar3) break;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102a6a;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1);
      __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + *puVar8);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102a95;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102aaa;
    poVar5 = std::operator<<((ostream *)&std::cout,"Avg Delay:");
    auVar10._8_4_ = (int)((ulong)__range1 >> 0x20);
    auVar10._0_8_ = __range1;
    auVar10._12_4_ = 0x45300000;
    local_440 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102b00;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,((auVar10._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
                               (double)(int)(glb::N * glb::numTrans));
    local_448 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102b1c;
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102b43;
    __end1_1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts
                         );
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102b56;
    e_1 = (unsigned_long)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts);
    while( true ) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102b70;
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&e_1);
      if (!bVar3) break;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102b82;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1_1);
      uStack_2b0 = *puVar8;
      __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + uStack_2b0);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102bad;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1_1);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102bc2;
    poVar5 = std::operator<<((ostream *)&std::cout,"Avg Aborts:");
    auVar11._8_4_ = (int)((ulong)__range1 >> 0x20);
    auVar11._0_8_ = __range1;
    auVar11._12_4_ = 0x45300000;
    local_450 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102c18;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,((auVar11._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
                               (double)(int)(glb::N * glb::numTrans));
    local_458 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102c34;
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102c42;
    fclose(glb::log_file);
    for (local_2b4 = 0; local_2b4 < (int)glb::N; local_2b4 = local_2b4 + 1) {
      local_2c0 = 0;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102c7a;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts,
                 &local_2c0);
      foccCta = (FOCC_CTA *)0x0;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102c9a;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay,
                 (value_type *)&foccCta);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102cc2;
    std::operator<<((ostream *)&std::cout,"\n***** FOCC CTA ******\n");
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102cce;
    pFVar6 = (FOCC_CTA *)operator_new(0x90);
    local_460 = pFVar6;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102ce9;
    FOCC_CTA::FOCC_CTA(pFVar6,glb::M);
    pFStack_2d0 = local_460;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102d0c;
    glb::log_file = fopen("FOCC-CTA-log.txt","w");
    local_468 = glb::log_file;
    for (local_2d4 = 0; local_2d4 < (int)glb::N; local_2d4 = local_2d4 + 1) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102d60;
      std::thread::thread<void(&)(FOCC_CTA*,int),FOCC_CTA*&,int&,void>
                ((thread *)&stack0xfffffffffffffd20,updtMem2,&stack0xfffffffffffffd30,&local_2d4);
      ptVar9 = local_408 + local_2d4;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102d83;
      std::thread::operator=(ptVar9,(thread *)&stack0xfffffffffffffd20);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102d8f;
      std::thread::~thread((thread *)&stack0xfffffffffffffd20);
    }
    for (__range1_2._4_4_ = 0; pFVar6 = pFStack_2d0, __range1_2._4_4_ < (int)glb::N;
        __range1_2._4_4_ = __range1_2._4_4_ + 1) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102df7;
      std::thread::join();
    }
    local_470 = pFStack_2d0;
    if (pFStack_2d0 != (FOCC_CTA *)0x0) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102e2c;
      FOCC_CTA::~FOCC_CTA(pFVar6);
      pFVar6 = local_470;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102e3d;
      operator_delete(pFVar6,0x90);
    }
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102e62;
    __end1_2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay)
    ;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102e75;
    e_2 = (unsigned_long)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay);
    while( true ) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102e8f;
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_2,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&e_2);
      if (!bVar3) break;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102ea1;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1_2);
      __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + *puVar8);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102ecc;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1_2);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102ee1;
    poVar5 = std::operator<<((ostream *)&std::cout,"Avg Delay:");
    auVar12._8_4_ = (int)((ulong)__range1 >> 0x20);
    auVar12._0_8_ = __range1;
    auVar12._12_4_ = 0x45300000;
    local_478 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102f37;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,((auVar12._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
                               (double)(int)(glb::N * glb::numTrans));
    local_480 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102f53;
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102f7a;
    __end1_3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts
                         );
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102f8d;
    e_3 = (unsigned_long)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts);
    while( true ) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102fa7;
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&e_3);
      if (!bVar3) break;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102fb9;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1_3);
      uStack_328 = *puVar8;
      __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + uStack_328);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102fe4;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1_3);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x102ff9;
    poVar5 = std::operator<<((ostream *)&std::cout,"Avg Aborts:");
    auVar13._8_4_ = (int)((ulong)__range1 >> 0x20);
    auVar13._0_8_ = __range1;
    auVar13._12_4_ = 0x45300000;
    local_488 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10304f;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,((auVar13._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
                               (double)(int)(glb::N * glb::numTrans));
    local_490 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10306b;
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (local_32c = 0; local_32c < (int)glb::N; local_32c = local_32c + 1) {
      local_338 = 0;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1030a3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts,
                 &local_338);
      boccCta = (BOCC_CTA *)0x0;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1030c3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay,
                 (value_type *)&boccCta);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1030eb;
    std::operator<<((ostream *)&std::cout,"\n***** BOCC CTA ******\n");
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1030f7;
    pBVar7 = (BOCC_CTA *)operator_new(0x98);
    local_498 = pBVar7;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103112;
    BOCC_CTA::BOCC_CTA(pBVar7,glb::M);
    pBStack_348 = local_498;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103135;
    glb::log_file = fopen("BOCC-CTA-log.txt","w");
    local_4a0 = glb::log_file;
    for (local_34c = 0; local_34c < (int)glb::N; local_34c = local_34c + 1) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103189;
      std::thread::thread<void(&)(BOCC_CTA*,int),BOCC_CTA*&,int&,void>
                ((thread *)&stack0xfffffffffffffca8,updtMem3,&stack0xfffffffffffffcb8,&local_34c);
      ptVar9 = local_408 + local_34c;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1031ac;
      std::thread::operator=(ptVar9,(thread *)&stack0xfffffffffffffca8);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1031b8;
      std::thread::~thread((thread *)&stack0xfffffffffffffca8);
    }
    for (__range1_4._4_4_ = 0; pBVar7 = pBStack_348, __range1_4._4_4_ < (int)glb::N;
        __range1_4._4_4_ = __range1_4._4_4_ + 1) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103220;
      std::thread::join();
    }
    local_4a8 = pBStack_348;
    if (pBStack_348 != (BOCC_CTA *)0x0) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103255;
      BOCC_CTA::~BOCC_CTA(pBVar7);
      pBVar7 = local_4a8;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103266;
      operator_delete(pBVar7,0x98);
    }
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10328b;
    __end1_4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay)
    ;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10329e;
    e_4 = (unsigned_long)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_delay);
    while( true ) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1032b8;
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_4,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&e_4);
      if (!bVar3) break;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1032ca;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1_4);
      __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + *puVar8);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1032f5;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1_4);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10330a;
    poVar5 = std::operator<<((ostream *)&std::cout,"Avg Delay:");
    auVar14._8_4_ = (int)((ulong)__range1 >> 0x20);
    auVar14._0_8_ = __range1;
    auVar14._12_4_ = 0x45300000;
    local_4b0 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103360;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,((auVar14._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
                               (double)(int)(glb::N * glb::numTrans));
    local_4b8 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10337c;
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1033a3;
    __end1_5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts
                         );
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1033b6;
    e_5 = (unsigned_long)
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)glb::total_aborts);
    while( true ) {
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1033d0;
      bVar3 = __gnu_cxx::operator!=
                        (&__end1_5,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&e_5);
      if (!bVar3) break;
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1033e2;
      puVar8 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end1_5);
      local_3a0 = *puVar8;
      __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + local_3a0);
      *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x10340d;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end1_5);
    }
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103422;
    poVar5 = std::operator<<((ostream *)&std::cout,"Avg Aborts:");
    auVar15._8_4_ = (int)((ulong)__range1 >> 0x20);
    auVar15._0_8_ = __range1;
    auVar15._12_4_ = 0x45300000;
    local_4c0 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103478;
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (poVar5,((auVar15._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0)) /
                               (double)(int)(glb::N * glb::numTrans));
    local_4c8 = poVar5;
    *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x103494;
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_4d0 = local_408 + local_410;
    if (local_408 != local_4d0) {
      do {
        ptVar9 = local_4d0 + -1;
        local_4d8 = ptVar9;
        *(undefined8 *)((long)atStack_4e8 + lVar1 + -8) = 0x1034d8;
        std::thread::~thread(ptVar9);
        local_4d0 = local_4d8;
      } while (local_4d8 != local_408);
    }
    *(undefined8 *)(__vla_expr0 - 8) = 0x103508;
    std::ifstream::~ifstream(local_218);
    return 0;
  }
  puStack_4f0 = (undefined1 *)0x1025d9;
  std::operator<<((ostream *)&std::cerr,"inp-params.txt NOT FOUND!\n");
  puStack_4f0 = &LAB_001025e5;
  exit(1);
}

Assistant:

int main() {
    srand(time(nullptr));

    std::ifstream inFile{"inp-params.txt", std::ifstream::in};
    if(inFile.fail()){
        std::cerr<<"inp-params.txt NOT FOUND!\n";
        exit(1);
    }
    inFile>>glb::N>>glb::M>>glb::numTrans>>glb::constVal>>glb::lambda;

    // initialization.
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"Input Params: N="<<glb::N<<" M = "<<glb::M<<" numTrans = "<<glb::numTrans<<"\n";

    glb::dist = std::exponential_distribution<double>(glb::lambda);

    // -- FOCC OTA ----
    std::cout<<"***** FOCC OTA ******\n";
    glb::foccOta = new FOCC_OTA(glb::M);

    std::thread tids[glb::N];

    glb::log_file = fopen("FOCC-OTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem, glb::foccOta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();
    delete glb::foccOta;

    uint64_t res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    fclose(glb::log_file);


    // -- FOCC CTA ----
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"\n***** FOCC CTA ******\n";

    FOCC_CTA * foccCta = new FOCC_CTA(glb::M);


    glb::log_file = fopen("FOCC-CTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem2, foccCta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();

    delete foccCta;

    res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;

    // -- FOCC CTA ----
    for(int i=0; i<glb::N; i++) {
        glb::total_aborts.push_back(0);
        glb::total_delay.push_back(0);
    }

    std::cout<<"\n***** BOCC CTA ******\n";

    BOCC_CTA * boccCta = new BOCC_CTA(glb::M);


    glb::log_file = fopen("BOCC-CTA-log.txt", "w");
    for(int i=0; i<glb::N; i++) tids[i] =  std::thread(updtMem3, boccCta,i);
    for(int i=0; i<glb::N; i++) tids[i].join();

    delete boccCta;

    res = 0;
    for(auto e: glb::total_delay) res+=e;
    std::cout<<"Avg Delay:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;
    res = 0;
    for(auto e: glb::total_aborts) res+=e;
    //std::cout<<"tota bors: "<<res<<"\n";
    std::cout<<"Avg Aborts:"<<(((double)res)/(glb::N*glb::numTrans))<<std::endl;

    return 0;
}